

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_apply(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  uint64_t lab_03;
  uint64_t lab_04;
  uint64_t lab_05;
  uint64_t lab_06;
  uint64_t lab_07;
  uint64_t lab_08;
  uint64_t lab_09;
  uint64_t lab_10;
  string all_args_set;
  string rep_arg_set;
  string rep_arg_set_clos;
  string rep_arg_set_clos_done;
  string all_args_set_clos;
  string rep_arg_set_done;
  string unravel;
  string repeat;
  string unraveled;
  string done;
  string error;
  string proc;
  string clos;
  operand local_1e4;
  operand local_1e0 [2];
  string local_1d8;
  string local_1b8;
  string local_198;
  operand local_174;
  string local_170;
  string local_150;
  string local_130;
  operand local_10c;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  psVar1 = label;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  label_to_string_abi_cxx11_(&local_68,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_48,psVar1,lab);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_e8,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,local_e8._M_dataplus._M_p._0_4_) !=
        &local_e8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_e8._M_dataplus._M_p._4_4_,local_e8._M_dataplus._M_p._0_4_),
                      local_e8.field_2._M_allocated_capacity + 1);
    }
    local_e8._M_dataplus._M_p._0_4_ = 5;
    local_a8._M_dataplus._M_p._0_4_ = 0x14;
    local_108._M_dataplus._M_p._0_4_ = 0x39;
    local_c8._M_dataplus._M_p._0_4_ = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_e8,(operand *)&local_a8,(operand *)&local_108,
               (int *)&local_c8);
    local_e8._M_dataplus._M_p._0_4_ = 0x30;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_e8,&local_88);
  }
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 9;
  local_108._M_dataplus._M_p._0_4_ = 0x23;
  local_c8._M_dataplus._M_p._0_4_ = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e8,(operand *)&local_a8,(operand *)&local_108,(int *)&local_c8
            );
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 0x19;
  local_108._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e8,(operand *)&local_a8,(operand *)&local_108);
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 0x19;
  local_108._M_dataplus._M_p._0_4_ = 8;
  local_c8._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_e8,(operand *)&local_a8,(int *)&local_108,(operand *)&local_c8
            );
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 0x19;
  local_108._M_dataplus._M_p._0_4_ = 0x10;
  local_c8._M_dataplus._M_p._0_4_ = 0xd;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_e8,(operand *)&local_a8,(int *)&local_108,(operand *)&local_c8
            );
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 0x19;
  local_108._M_dataplus._M_p._0_4_ = 0x18;
  local_c8._M_dataplus._M_p._0_4_ = 0xe;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_e8,(operand *)&local_a8,(int *)&local_108,(operand *)&local_c8
            );
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 0x19;
  local_108._M_dataplus._M_p._0_4_ = 0x20;
  local_c8._M_dataplus._M_p._0_4_ = 0x11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_e8,(operand *)&local_a8,(int *)&local_108,(operand *)&local_c8
            );
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 0x19;
  local_108._M_dataplus._M_p._0_4_ = 0x28;
  local_c8._M_dataplus._M_p._0_4_ = 0x12;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_e8,(operand *)&local_a8,(int *)&local_108,(operand *)&local_c8
            );
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 0x19;
  local_108._M_dataplus._M_p._0_4_ = 0x30;
  local_c8._M_dataplus._M_p._0_4_ = 0x15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_e8,(operand *)&local_a8,(int *)&local_108,(operand *)&local_c8
            );
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 0x19;
  local_108._M_dataplus._M_p._0_4_ = 0x38;
  local_c8._M_dataplus._M_p._0_4_ = 0x17;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_e8,(operand *)&local_a8,(int *)&local_108,(operand *)&local_c8
            );
  local_e8._M_dataplus._M_p._0_4_ = 0x40;
  local_a8._M_dataplus._M_p._0_4_ = 0xc;
  local_108._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_e8,(operand *)&local_a8,(operand *)&local_108);
  local_e8._M_dataplus._M_p._0_4_ = 0;
  local_a8._M_dataplus._M_p._0_4_ = 9;
  local_108._M_dataplus._M_p._0_4_ = 0x39;
  local_c8._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e8,(operand *)&local_a8,(operand *)&local_108,(int *)&local_c8
            );
  local_e8._M_dataplus._M_p._0_4_ = 0x58;
  local_a8._M_dataplus._M_p._0_4_ = 0x14;
  local_108._M_dataplus._M_p._0_4_ = 0x39;
  local_c8._M_dataplus._M_p._0_4_ = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_e8,(operand *)&local_a8,(operand *)&local_108,(int *)&local_c8
            );
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_e8,psVar1,lab_01);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_a8,psVar1,lab_02);
  local_108._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_108,&local_e8);
  local_108._M_dataplus._M_p._0_4_ = 5;
  local_c8._M_dataplus._M_p._0_4_ = 0x14;
  local_150._M_dataplus._M_p._0_4_ = 0x39;
  local_198._M_dataplus._M_p._0_4_ = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_108,(operand *)&local_c8,(operand *)&local_150,
             (int *)&local_198);
  local_108._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_108,&local_a8);
  local_108._M_dataplus._M_p._0_4_ = 0xd;
  local_c8._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_108,(operand *)&local_c8);
  local_108._M_dataplus._M_p._0_4_ = 0;
  local_c8._M_dataplus._M_p._0_4_ = 9;
  local_150._M_dataplus._M_p._0_4_ = 0x39;
  local_198._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_108,(operand *)&local_c8,(operand *)&local_150,
             (int *)&local_198);
  local_108._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_108,&local_e8);
  local_108._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_108,&local_a8);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_108,psVar1,lab_03);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_c8,psVar1,lab_04);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0x14;
  local_170._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170);
  local_150._M_dataplus._M_p._0_4_ = 0x58;
  local_198._M_dataplus._M_p._0_4_ = 0x14;
  local_170._M_dataplus._M_p._0_4_ = 0x39;
  local_1d8._M_dataplus._M_p._0_4_ = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0x18;
  local_170._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170);
  local_150._M_dataplus._M_p._0_4_ = 5;
  local_198._M_dataplus._M_p._0_4_ = 0x18;
  local_170._M_dataplus._M_p._0_4_ = 0x39;
  local_1d8._M_dataplus._M_p._0_4_ = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_150,&local_c8);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,R15,RDX,&local_88);
  }
  local_198._M_dataplus._M_p._0_4_ = 2;
  local_170._M_dataplus._M_p._0_4_ = 0x18;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_150._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (unsigned_long *)&local_150);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_pair(code,R15,RDX,&local_88);
  }
  local_150._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_150,&local_108);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0xc;
  local_170._M_dataplus._M_p._0_4_ = 0x28;
  local_1d8._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0x19;
  local_170._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170);
  local_150._M_dataplus._M_p._0_4_ = 0x2b;
  local_198._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0xc;
  local_170._M_dataplus._M_p._0_4_ = 0x28;
  local_1d8._M_dataplus._M_p._0_4_ = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 5;
  local_198._M_dataplus._M_p._0_4_ = 0xc;
  local_170._M_dataplus._M_p._0_4_ = 0x39;
  local_1d8._M_dataplus._M_p._0_4_ = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_150,&local_c8);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,RDX,R15,&local_88);
  }
  local_198._M_dataplus._M_p._0_4_ = 2;
  local_170._M_dataplus._M_p._0_4_ = 0xc;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_150._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (unsigned_long *)&local_150);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_pair(code,RDX,R15,&local_88);
  }
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0x18;
  local_170._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170);
  local_150._M_dataplus._M_p._0_4_ = 0;
  local_198._M_dataplus._M_p._0_4_ = 9;
  local_170._M_dataplus._M_p._0_4_ = 0x39;
  local_1d8._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_150,&local_108);
  local_150._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_150,&local_c8);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 9;
  local_170._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170);
  local_150._M_dataplus._M_p._0_4_ = 2;
  local_198._M_dataplus._M_p._0_4_ = 9;
  local_170._M_dataplus._M_p._0_4_ = 0x39;
  local_1d8._M_dataplus._M_p._0_4_ = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 5;
  local_198._M_dataplus._M_p._0_4_ = 9;
  local_170._M_dataplus._M_p._0_4_ = 0x39;
  local_1d8._M_dataplus._M_p._0_4_ = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_150,&local_68);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,RCX,R15,&local_88);
    local_198._M_dataplus._M_p._0_4_ = 2;
    local_170._M_dataplus._M_p._0_4_ = 0xb;
    local_1d8._M_dataplus._M_p._0_4_ = 0x39;
    local_150._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
              (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
               (unsigned_long *)&local_150);
    jump_if_arg_does_not_point_to_closure(code,RCX,R15,&local_88);
    local_150._M_dataplus._M_p._0_4_ = 0x49;
    local_198._M_dataplus._M_p._0_4_ = 0xb;
    local_170._M_dataplus._M_p._0_4_ = 0x39;
    local_1d8._M_dataplus._M_p._0_4_ = 5;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
               (int *)&local_1d8);
  }
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 9;
  local_170._M_dataplus._M_p._0_4_ = 0x39;
  local_1d8._M_dataplus._M_p._0_4_ = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_198._M_dataplus._M_p._0_4_ = 0x40;
  local_170._M_dataplus._M_p._0_4_ = 0x18;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_150._M_dataplus._M_p = (pointer)0x400000000000000;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (unsigned_long *)&local_150);
  local_150._M_dataplus._M_p._0_4_ = 0x49;
  local_198._M_dataplus._M_p._0_4_ = 9;
  local_170._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0x20;
  local_170._M_dataplus._M_p._0_4_ = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0x18;
  local_170._M_dataplus._M_p._0_4_ = 0x42;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,char_const(&)[11]>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (char (*) [11])"L_identity");
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0x20;
  local_170._M_dataplus._M_p._0_4_ = 8;
  local_1d8._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(int *)&local_170,
             (operand *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0x18;
  local_170._M_dataplus._M_p._0_4_ = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170);
  local_150._M_dataplus._M_p._0_4_ = 0x49;
  local_198._M_dataplus._M_p._0_4_ = 0x18;
  local_170._M_dataplus._M_p._0_4_ = 0x39;
  local_1d8._M_dataplus._M_p._0_4_ = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 0;
  local_198._M_dataplus._M_p._0_4_ = 0x10;
  local_170._M_dataplus._M_p._0_4_ = 0x39;
  local_1d8._M_dataplus._M_p._0_4_ = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170,
             (int *)&local_1d8);
  local_150._M_dataplus._M_p._0_4_ = 0x40;
  local_198._M_dataplus._M_p._0_4_ = 0xc;
  local_170._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_150,(operand *)&local_198,(operand *)&local_170);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_150,psVar1,lab_05);
  local_198._M_dataplus._M_p._0_4_ = 5;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_198,&local_150);
  local_198._M_dataplus._M_p._0_4_ = 0x40;
  local_170._M_dataplus._M_p._0_4_ = 9;
  local_1d8._M_dataplus._M_p._0_4_ = 0x23;
  local_1b8._M_dataplus._M_p._0_4_ = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0;
  local_170._M_dataplus._M_p._0_4_ = 9;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x40;
  local_170._M_dataplus._M_p._0_4_ = 0xd;
  local_1d8._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8);
  local_198._M_dataplus._M_p._0_4_ = 5;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_198,&local_150);
  local_198._M_dataplus._M_p._0_4_ = 0;
  local_170._M_dataplus._M_p._0_4_ = 9;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x40;
  local_170._M_dataplus._M_p._0_4_ = 0xe;
  local_1d8._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8);
  local_198._M_dataplus._M_p._0_4_ = 5;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_198,&local_150);
  local_198._M_dataplus._M_p._0_4_ = 0;
  local_170._M_dataplus._M_p._0_4_ = 9;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x40;
  local_170._M_dataplus._M_p._0_4_ = 0x11;
  local_1d8._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8);
  local_198._M_dataplus._M_p._0_4_ = 5;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_198,&local_150);
  local_198._M_dataplus._M_p._0_4_ = 0;
  local_170._M_dataplus._M_p._0_4_ = 9;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x40;
  local_170._M_dataplus._M_p._0_4_ = 0x12;
  local_1d8._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8);
  local_198._M_dataplus._M_p._0_4_ = 5;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_198,&local_150);
  local_198._M_dataplus._M_p._0_4_ = 0;
  local_170._M_dataplus._M_p._0_4_ = 9;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x40;
  local_170._M_dataplus._M_p._0_4_ = 0x15;
  local_1d8._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8);
  local_198._M_dataplus._M_p._0_4_ = 5;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_198,&local_150);
  local_198._M_dataplus._M_p._0_4_ = 0;
  local_170._M_dataplus._M_p._0_4_ = 9;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x40;
  local_170._M_dataplus._M_p._0_4_ = 0x17;
  local_1d8._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8);
  local_198._M_dataplus._M_p._0_4_ = 5;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_198,&local_150);
  local_198._M_dataplus._M_p._0_4_ = 0x4b;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170);
  local_198._M_dataplus._M_p._0_4_ = 0x58;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x40;
  local_170._M_dataplus._M_p._0_4_ = 0x18;
  local_1d8._M_dataplus._M_p._0_4_ = 0x23;
  local_1b8._M_dataplus._M_p._0_4_ = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x55;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0;
  local_170._M_dataplus._M_p._0_4_ = 0x18;
  local_1d8._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8);
  local_198._M_dataplus._M_p._0_4_ = 0;
  local_170._M_dataplus._M_p._0_4_ = 9;
  local_1d8._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8);
  local_198._M_dataplus._M_p._0_4_ = 0x56;
  local_170._M_dataplus._M_p._0_4_ = 0x14;
  local_1d8._M_dataplus._M_p._0_4_ = 0x39;
  local_1b8._M_dataplus._M_p._0_4_ = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_198,(operand *)&local_170,(operand *)&local_1d8,
             (int *)&local_1b8);
  local_198._M_dataplus._M_p._0_4_ = 0x4b;
  local_170._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_198,(operand *)&local_170);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_198,psVar1,lab_06);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_170,psVar1,lab_07);
  local_1d8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1d8,&local_198);
  local_1d8._M_dataplus._M_p._0_4_ = 0x58;
  local_1b8._M_dataplus._M_p._0_4_ = 0x18;
  local_130._M_dataplus._M_p._0_4_ = 0x39;
  local_1e0[0] = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1d8,(operand *)&local_1b8,(operand *)&local_130,
             (int *)local_1e0);
  local_1d8._M_dataplus._M_p._0_4_ = 0x40;
  local_1b8._M_dataplus._M_p._0_4_ = 0xb;
  local_130._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8,(operand *)&local_130);
  local_1d8._M_dataplus._M_p._0_4_ = 0x40;
  local_1b8._M_dataplus._M_p._0_4_ = 0x28;
  local_130._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8,(operand *)&local_130);
  local_1d8._M_dataplus._M_p._0_4_ = 0x58;
  local_1b8._M_dataplus._M_p._0_4_ = 9;
  local_130._M_dataplus._M_p._0_4_ = 0x39;
  local_1e0[0] = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1d8,(operand *)&local_1b8,(operand *)&local_130,
             (int *)local_1e0);
  local_1d8._M_dataplus._M_p._0_4_ = 0xd;
  local_1b8._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8);
  local_1d8._M_dataplus._M_p._0_4_ = 5;
  local_1b8._M_dataplus._M_p._0_4_ = 0x14;
  local_130._M_dataplus._M_p._0_4_ = 0x39;
  local_1e0[0] = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1d8,(operand *)&local_1b8,(operand *)&local_130,
             (int *)local_1e0);
  local_1d8._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1d8,&local_170);
  local_1d8._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1d8,&local_198);
  local_1d8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1d8,&local_170);
  local_1d8._M_dataplus._M_p._0_4_ = 0x4a;
  local_1b8._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8);
  local_1d8._M_dataplus._M_p._0_4_ = 0x4a;
  local_1b8._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8);
  local_1d8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1d8,&local_150);
  local_1d8._M_dataplus._M_p._0_4_ = 0;
  local_1b8._M_dataplus._M_p._0_4_ = 0x14;
  local_130._M_dataplus._M_p._0_4_ = 0x39;
  local_1e0[0] = AH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1d8,(operand *)&local_1b8,(operand *)&local_130,
             (int *)local_1e0);
  local_1d8._M_dataplus._M_p._0_4_ = 0x40;
  local_1b8._M_dataplus._M_p._0_4_ = 9;
  local_130._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8,(operand *)&local_130);
  local_1b8._M_dataplus._M_p._0_4_ = 2;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1d8._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,
             (unsigned_long *)&local_1d8);
  local_1d8._M_dataplus._M_p._0_4_ = 0x40;
  local_1b8._M_dataplus._M_p._0_4_ = 0x18;
  local_130._M_dataplus._M_p._0_4_ = 0x19;
  local_1e0[0] = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1d8,(operand *)&local_1b8,(operand *)&local_130,
             (int *)local_1e0);
  local_1d8._M_dataplus._M_p._0_4_ = 0x4b;
  local_1b8._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8);
  local_1d8._M_dataplus._M_p._0_4_ = 0x2c;
  local_1b8._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8);
  local_1d8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[23]>
            (code,(operation *)&local_1d8,(char (*) [23])"L_return_from_identity");
  local_1d8._M_dataplus._M_p._0_4_ = 0x4a;
  local_1b8._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8);
  local_1d8._M_dataplus._M_p._0_4_ = 0x2c;
  local_1b8._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_1d8,(operand *)&local_1b8);
  local_1d8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1d8,&local_68);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_1d8,psVar1,lab_08);
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1b8,&local_1d8);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = MEM_R10;
  local_1e4 = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 0xb;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0);
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1b8,&local_1d8);
  local_1b8._M_dataplus._M_p._0_4_ = 0;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 0xc;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0);
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = AH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1b8,&local_1d8);
  local_1b8._M_dataplus._M_p._0_4_ = 0;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 0xd;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0);
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = BL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1b8,&local_1d8);
  local_1b8._M_dataplus._M_p._0_4_ = 0;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 0xe;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0);
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = BH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1b8,&local_1d8);
  local_1b8._M_dataplus._M_p._0_4_ = 0;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 0x11;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0);
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = CL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1b8,&local_1d8);
  local_1b8._M_dataplus._M_p._0_4_ = 0;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 0x12;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0);
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = CH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1b8,&local_1d8);
  local_1b8._M_dataplus._M_p._0_4_ = 0;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 0x15;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0);
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = DL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1b8,&local_1d8);
  local_1b8._M_dataplus._M_p._0_4_ = 0;
  local_130._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 0x17;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0);
  local_1b8._M_dataplus._M_p._0_4_ = 5;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_1b8,&local_1d8);
  local_1b8._M_dataplus._M_p._0_4_ = 0x4b;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130);
  local_1b8._M_dataplus._M_p._0_4_ = 0x58;
  local_130._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x40;
  local_130._M_dataplus._M_p._0_4_ = 0x18;
  local_1e0[0] = MEM_R10;
  local_1e4 = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_1b8,(operand *)&local_130,local_1e0,(int *)&local_1e4);
  local_1b8._M_dataplus._M_p._0_4_ = 0x4b;
  local_130._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_1b8,(operand *)&local_130);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_1b8,psVar1,lab_09);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_130,psVar1,lab_10);
  local_1e0[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&local_1b8);
  local_1e0[0] = EMPTY;
  local_1e4 = RAX;
  local_174 = NUMBER;
  local_10c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1e0,&local_1e4,&local_174,(int *)&local_10c);
  local_1e0[0] = ST6;
  local_1e4 = RCX;
  local_174 = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4,&local_174);
  local_1e0[0] = ST6;
  local_1e4 = MEM_R15;
  local_174 = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4,&local_174);
  local_1e0[0] = EMPTY;
  local_1e4 = R15;
  local_174 = NUMBER;
  local_10c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1e0,&local_1e4,&local_174,(int *)&local_10c);
  local_1e0[0] = RSI;
  local_1e4 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4);
  local_1e0[0] = CL;
  local_1e4 = R11;
  local_174 = NUMBER;
  local_10c = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1e0,&local_1e4,&local_174,(int *)&local_10c);
  local_1e0[0] = BYTE_MEM_R15;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&local_130);
  local_1e0[0] = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&local_1b8);
  local_1e0[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&local_130);
  local_1e0[0] = XMM7;
  local_1e4 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4);
  local_1e0[0] = XMM7;
  local_1e4 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4);
  local_1e0[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&local_1d8);
  local_1e0[0] = ST6;
  local_1e4 = RAX;
  local_174 = MEM_R10;
  local_10c = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1e0,&local_1e4,&local_174,(int *)&local_10c);
  local_1e0[0] = 0x40;
  local_1e4 = R15;
  local_174 = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4,&local_174);
  local_1e4 = AH;
  local_174 = R15;
  local_10c = NUMBER;
  local_1e0[0] = ~DL;
  local_1e0[1] = ~EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_1e4,&local_174,&local_10c,(unsigned_long *)local_1e0);
  local_1e0[0] = 0x2c;
  local_1e4 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4);
  if (ops->safe_primitives == true) {
    error_label(code,&local_88,re_apply_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_130._M_dataplus._M_p._4_4_,local_130._M_dataplus._M_p._0_4_) !=
      &local_130.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_130._M_dataplus._M_p._4_4_,local_130._M_dataplus._M_p._0_4_),
                    local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1b8._M_dataplus._M_p._4_4_,local_1b8._M_dataplus._M_p._0_4_) !=
      &local_1b8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1b8._M_dataplus._M_p._4_4_,local_1b8._M_dataplus._M_p._0_4_),
                    local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_170._M_dataplus._M_p._4_4_,local_170._M_dataplus._M_p._0_4_) !=
      &local_170.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_170._M_dataplus._M_p._4_4_,local_170._M_dataplus._M_p._0_4_),
                    local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_198._M_dataplus._M_p._4_4_,local_198._M_dataplus._M_p._0_4_) !=
      &local_198.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_198._M_dataplus._M_p._4_4_,local_198._M_dataplus._M_p._0_4_),
                    local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,local_c8._M_dataplus._M_p._0_4_) !=
      &local_c8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_c8._M_dataplus._M_p._4_4_,local_c8._M_dataplus._M_p._0_4_),
                    local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
      &local_108.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                    local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_),
                    local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,local_e8._M_dataplus._M_p._0_4_) !=
      &local_e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_e8._M_dataplus._M_p._4_4_,local_e8._M_dataplus._M_p._0_4_),
                    local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_apply(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string proc = label_to_string(label++);
  std::string clos = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JL, error);
    }

  //we move all registers in GC_SAVE, then all args are linear in memory (GC_SAVE is followed by LOCALS)
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::MOV, asmcode::MEM_RAX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(1), asmcode::RDX);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(2), asmcode::RSI);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(3), asmcode::RDI);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(4), asmcode::R8);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(5), asmcode::R9);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(6), asmcode::R12);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(7), asmcode::R14);

  code.add(asmcode::MOV, asmcode::RDX, asmcode::R11); // save r11 in rdx

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1)); // mem_rax now points to rdx = 2nd arg
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 2);

  //now we look for the last argument, which should be a list
  std::string repeat = label_to_string(label++);
  std::string done = label_to_string(label++);
  code.add(asmcode::LABEL, repeat);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JES, done); // last arg found, is in mem_rax
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::JMPS, repeat);
  code.add(asmcode::LABEL, done);

  std::string unravel = label_to_string(label++);
  std::string unraveled = label_to_string(label++);

  code.add(asmcode::MOV, asmcode::R11, asmcode::RDX); // get length again
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 2);
  // mem_rax now contains a list, let's check
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R15, asmcode::NUMBER, nil); // last element is nil, so that's fine
  code.add(asmcode::JE, unraveled);
  if (ops.safe_primitives)
    jump_if_arg_is_not_block(code, asmcode::R15, asmcode::RDX, error);
  code.add(asmcode::AND, asmcode::R15, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_if_arg_does_not_point_to_pair(code, asmcode::R15, asmcode::RDX, error);

  code.add(asmcode::LABEL, unravel);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_R15, CELLS(1)); // get car of pair in rdx
  code.add(asmcode::MOV, asmcode::MEM_RAX, asmcode::RDX);
  code.add(asmcode::INC, asmcode::R11);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_R15, CELLS(2)); // get cdr of pair in rdx
  code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, nil); // last element is nil, so all elements are unpacked
  code.add(asmcode::JE, unraveled);
  if (ops.safe_primitives)
    jump_if_arg_is_not_block(code, asmcode::RDX, asmcode::R15, error);
  code.add(asmcode::AND, asmcode::RDX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_if_arg_does_not_point_to_pair(code, asmcode::RDX, asmcode::R15, error);
  code.add(asmcode::MOV, asmcode::R15, asmcode::RDX);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::JMPS, unravel);
  code.add(asmcode::LABEL, unraveled);


  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, procedure_mask);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::NUMBER, procedure_tag);
  code.add(asmcode::JE, proc);
  if (ops.safe_primitives)
    {
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R15, error);
    code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
    jump_if_arg_does_not_point_to_closure(code, asmcode::RCX, asmcode::R15, error);
    code.add(asmcode::OR, asmcode::RCX, asmcode::NUMBER, block_tag); // add block tag again
    }
  // if we are here, then the apply is on a closure in rcx

  //first we make a fake cps object
  // todo: move this to the context. We don't need to create one each apply. We could reserve memory for it in the context
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, (uint64_t)closure_tag << (uint64_t)block_shift);
  code.add(asmcode::OR, asmcode::RAX, asmcode::R15);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R15, asmcode::LABELADDRESS, "L_identity");
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::R15);
  code.add(asmcode::MOV, asmcode::R15, ALLOC);
  code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));

  //rcx is ok, it contains the closure
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R15); // the cps object in rdx

  auto all_args_set_clos = label_to_string(label++);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JE, all_args_set_clos);
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RSI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RDI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R8, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R9, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 4);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R12, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 5);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R14, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::PUSH, asmcode::R11);
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::MOV, asmcode::R15, LOCAL);
  /*
  We have to go from the end to the front, as we'll otherwise overwrite data we still need, as GC_SAVE and LOCAL are next to each other in memory
  */
  code.add(asmcode::SHL, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::ADD, asmcode::R15, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::R11);
  code.add(asmcode::SHR, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::PUSH, asmcode::RCX);

  auto rep_arg_set_clos = label_to_string(label++);
  auto rep_arg_set_clos_done = label_to_string(label++);
  code.add(asmcode::LABEL, rep_arg_set_clos);
  code.add(asmcode::SUB, asmcode::R15, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RAX);
  code.add(asmcode::MOV, asmcode::MEM_R15, asmcode::RCX);
  code.add(asmcode::SUB, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JES, rep_arg_set_clos_done);
  code.add(asmcode::JMPS, rep_arg_set_clos);
  code.add(asmcode::LABEL, rep_arg_set_clos_done);
  code.add(asmcode::POP, asmcode::RCX);
  code.add(asmcode::POP, asmcode::R11);
  code.add(asmcode::LABEL, all_args_set_clos);
  code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RAX, CELLS(1));

  code.add(asmcode::PUSH, CONTINUE);
  code.add(asmcode::JMP, asmcode::R15); // call closure  
  code.add(asmcode::LABEL, "L_return_from_identity");

  code.add(asmcode::POP, CONTINUE);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, proc);
  // if we are here, then the apply is on a procedure in rcx

  auto all_args_set = label_to_string(label++);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JE, all_args_set);
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::JE, all_args_set);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RSI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RDI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 4);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R8, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 5);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R9, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R12, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 7);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R14, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::PUSH, asmcode::R11);
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::MOV, asmcode::R15, LOCAL);
  code.add(asmcode::PUSH, asmcode::RCX);
  /*
  We have to go from the front to the end (as opposed to the case for closures above), as we'll otherwise overwrite data we still need, as GC_SAVE and LOCAL are next to each other in memory
  */
  auto rep_arg_set = label_to_string(label++);
  auto rep_arg_set_done = label_to_string(label++);
  code.add(asmcode::LABEL, rep_arg_set);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RAX);
  code.add(asmcode::MOV, asmcode::MEM_R15, asmcode::RCX);
  code.add(asmcode::ADD, asmcode::R15, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JES, rep_arg_set_done);
  code.add(asmcode::JMPS, rep_arg_set);
  code.add(asmcode::LABEL, rep_arg_set_done);
  code.add(asmcode::POP, asmcode::RCX);
  code.add(asmcode::POP, asmcode::R11);
  code.add(asmcode::LABEL, all_args_set);
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RAX);
  code.add(asmcode::AND, asmcode::R15, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8); // get procedure address
  code.add(asmcode::JMP, asmcode::R15); // call primitive

  if (ops.safe_primitives)
    {
    error_label(code, error, re_apply_contract_violation);
    }
  }